

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcObject::~IfcObject(IfcObject *this)

{
  undefined1 *puVar1;
  
  *(undefined ***)&this[-1].field_0x50 = &PTR__IfcObject_007ee170;
  *(undefined ***)&this->field_0x38 = &PTR__IfcObject_007ee1e8;
  *(undefined ***)&this[-1].field_0xd8 = &PTR__IfcObject_007ee198;
  *(undefined ***)this = &PTR__IfcObject_007ee1c0;
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10,*(long *)&this->field_0x20 + 1);
  }
  *(undefined8 *)&this[-1].field_0x50 = 0x7ee300;
  *(undefined8 *)&this->field_0x38 = 0x7ee328;
  puVar1 = *(undefined1 **)
            &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x18;
  if (puVar1 != &this[-1].field_0xc0) {
    operator_delete(puVar1,*(long *)&this[-1].field_0xc0 + 1);
  }
  if ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL> *)*(undefined1 **)&this[-1].field_0x88
      != &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>) {
    operator_delete(*(undefined1 **)&this[-1].field_0x88,
                    (long)this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
                          _vptr_ObjectHelper + 1);
  }
  if (*(undefined1 **)&this[-1].field_0x60 != &this[-1].field_0x70) {
    operator_delete(*(undefined1 **)&this[-1].field_0x60,*(long *)&this[-1].field_0x70 + 1);
  }
  operator_delete(&this[-1].field_0x50,0xe8);
  return;
}

Assistant:

IfcObject() : Object("IfcObject") {}